

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void __thiscall cmTargetTraceDependencies::FollowName(cmTargetTraceDependencies *this,string *name)

{
  _Rb_tree_header *__y;
  _Base_ptr __n;
  cmTarget *this_00;
  vector<cmSourceFile*,std::allocator<cmSourceFile*>> *this_01;
  iterator __position;
  bool bVar1;
  int iVar2;
  iterator __pos;
  string *psVar3;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  string fullname;
  cmSourceFile *sf;
  cmSourcesWithOutput sources;
  string local_c8;
  string local_a8;
  size_type local_88;
  pointer local_80;
  cmSourcesWithOutput local_78;
  undefined8 local_58;
  undefined1 *local_50;
  undefined1 local_48 [32];
  
  __y = &(this->NameMap)._M_t._M_impl.super__Rb_tree_header;
  __pos = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourcesWithOutput>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourcesWithOutput>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourcesWithOutput>_>_>
          ::_M_lower_bound(&(this->NameMap)._M_t,
                           (_Link_type)
                           (this->NameMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                           &__y->_M_header,name);
  if (((_Rb_tree_header *)__pos._M_node != __y) &&
     (__n = __pos._M_node[1]._M_parent, __n == (_Base_ptr)name->_M_string_length)) {
    if (__n == (_Base_ptr)0x0) goto LAB_004ad094;
    iVar2 = bcmp(*(void **)(__pos._M_node + 1),(name->_M_dataplus)._M_p,(size_t)__n);
    if (iVar2 == 0) goto LAB_004ad094;
  }
  cmLocalGenerator::GetSourcesWithOutput(&local_78,this->LocalGenerator,name);
  if (local_78.Source == (cmSourceFile *)0x0 &&
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78.Target ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    bVar1 = cmsys::SystemTools::FileIsFullPath(name);
    if (!bVar1) {
      psVar3 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this->Makefile);
      local_a8._M_string_length = (size_type)(psVar3->_M_dataplus)._M_p;
      local_a8._M_dataplus._M_p = (pointer)psVar3->_M_string_length;
      local_a8.field_2._8_8_ = local_48;
      local_58 = 1;
      local_48[0] = 0x2f;
      local_a8.field_2._M_allocated_capacity = 1;
      local_80 = (name->_M_dataplus)._M_p;
      local_88 = name->_M_string_length;
      views._M_len = 3;
      views._M_array = (iterator)&local_a8;
      local_50 = (undefined1 *)local_a8.field_2._8_8_;
      cmCatViews_abi_cxx11_(&local_c8,views);
      psVar3 = cmMakefile::GetHomeOutputDirectory_abi_cxx11_(this->Makefile);
      cmsys::SystemTools::CollapseFullPath(&local_a8,&local_c8,psVar3);
      std::__cxx11::string::operator=((string *)&local_c8,(string *)&local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
        operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
      }
      cmLocalGenerator::GetSourcesWithOutput
                ((cmSourcesWithOutput *)&local_a8,this->LocalGenerator,&local_c8);
      local_78.SourceIsByproduct = (bool)local_a8.field_2._M_local_buf[0];
      local_78.Target = (cmTarget *)local_a8._M_dataplus._M_p;
      local_78.Source = (cmSourceFile *)local_a8._M_string_length;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
        operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
      }
    }
  }
  __pos = std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmSourcesWithOutput>,std::_Select1st<std::pair<std::__cxx11::string_const,cmSourcesWithOutput>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmSourcesWithOutput>>>
          ::_M_emplace_hint_unique<std::__cxx11::string_const&,cmSourcesWithOutput&>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,cmSourcesWithOutput>,std::_Select1st<std::pair<std::__cxx11::string_const,cmSourcesWithOutput>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmSourcesWithOutput>>>
                      *)&this->NameMap,__pos._M_node,name,&local_78);
LAB_004ad094:
  if (*(cmTarget **)(__pos._M_node + 2) != (cmTarget *)0x0) {
    this_00 = this->GeneratorTarget->Target;
    psVar3 = cmTarget::GetName_abi_cxx11_(*(cmTarget **)(__pos._M_node + 2));
    cmTarget::AddUtility(this_00,psVar3,false,(cmMakefile *)0x0);
  }
  local_a8._M_dataplus._M_p = (pointer)__pos._M_node[2]._M_parent;
  if (((cmSourceFile *)local_a8._M_dataplus._M_p != (cmSourceFile *)0x0) &&
     (*(char *)&__pos._M_node[2]._M_left == '\0')) {
    this_01 = (vector<cmSourceFile*,std::allocator<cmSourceFile*>> *)this->CurrentEntry;
    if (this_01 != (vector<cmSourceFile*,std::allocator<cmSourceFile*>> *)0x0) {
      __position._M_current = *(cmSourceFile ***)(this_01 + 8);
      if (__position._M_current == *(cmSourceFile ***)(this_01 + 0x10)) {
        std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>::
        _M_realloc_insert<cmSourceFile*const&>(this_01,__position,(cmSourceFile **)&local_a8);
      }
      else {
        *__position._M_current = (cmSourceFile *)local_a8._M_dataplus._M_p;
        *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 8;
      }
    }
    QueueSource(this,(cmSourceFile *)local_a8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void cmTargetTraceDependencies::FollowName(std::string const& name)
{
  // Use lower bound with key comparison to not repeat the search for the
  // insert position if the name could not be found (which is the common case).
  auto i = this->NameMap.lower_bound(name);
  if (i == this->NameMap.end() || i->first != name) {
    // Check if we know how to generate this file.
    cmSourcesWithOutput sources =
      this->LocalGenerator->GetSourcesWithOutput(name);
    // If we failed to find a target or source and we have a relative path, it
    // might be a valid source if made relative to the current binary
    // directory.
    if (!sources.Target && !sources.Source &&
        !cmSystemTools::FileIsFullPath(name)) {
      auto fullname =
        cmStrCat(this->Makefile->GetCurrentBinaryDirectory(), '/', name);
      fullname = cmSystemTools::CollapseFullPath(
        fullname, this->Makefile->GetHomeOutputDirectory());
      sources = this->LocalGenerator->GetSourcesWithOutput(fullname);
    }
    i = this->NameMap.emplace_hint(i, name, sources);
  }
  if (cmTarget* t = i->second.Target) {
    // The name is a byproduct of a utility target or a PRE_BUILD, PRE_LINK, or
    // POST_BUILD command.
    this->GeneratorTarget->Target->AddUtility(t->GetName(), false);
  }
  if (cmSourceFile* sf = i->second.Source) {
    // For now only follow the dependency if the source file is not a
    // byproduct.  Semantics of byproducts in a non-Ninja context will have to
    // be defined first.
    if (!i->second.SourceIsByproduct) {
      // Record the dependency we just followed.
      if (this->CurrentEntry) {
        this->CurrentEntry->Depends.push_back(sf);
      }
      this->QueueSource(sf);
    }
  }
}